

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O3

void selector(item *x)

{
  item *x_00;
  typeDesc *ptVar1;
  object *y;
  int indLev;
  char *msg;
  
  x_00 = (item *)calloc(1,0x30);
  y = (object *)0x0;
  indLev = 0;
  while( true ) {
    while (currentSymbol == 0x130) {
      getSymbol();
      simpleExpression(x_00);
      ptVar1 = getType(x->typeIndex);
      if (ptVar1->form != 0x322) {
        msg = "not an array";
        goto LAB_00106c99;
      }
      idx(x,x_00);
      if (currentSymbol != 0x12f) {
        msg = "missing right bracket";
        goto LAB_00106c99;
      }
      getSymbol();
    }
    if (currentSymbol != 0xcd) {
      return;
    }
    getSymbol();
    if (currentSymbol != 0x1f5) break;
    ptVar1 = getType(x->typeIndex);
    if (ptVar1->base->form == 0x323) {
      y = findField(ptVar1->base->fields);
      getSymbol();
    }
    if (y == guard) {
      msg = "field undef";
LAB_00106c99:
      mark(msg);
      exit(-1);
    }
    emitField(x,y,indLev);
    indLev = indLev + 1;
  }
  msg = "missing identifier";
  goto LAB_00106c99;
}

Assistant:

procedure
void selector(struct item *x) {
	variable struct object *obj;
	variable struct typeDesc *type;
	variable struct item *y;
	variable int indLev; 
	y = NULL; type = NULL; obj = NULL; indLev = 0;
	allocMem(y);
	while ((currentSymbol == SYMBOL_LBRAK) || (currentSymbol == SYMBOL_ARROW)) {
		
		/* deal with array access */
		if (currentSymbol == SYMBOL_LBRAK) {
			getSymbol();
			simpleExpression(y);
			type = getType(x->typeIndex);
			if (type->form == FORM_ARRAY) {
				idx(x,y);
			} else {
				mark("not an array");
				exit(-1);
			}
			if (currentSymbol == SYMBOL_RBRAK) {
				getSymbol();
			} else {
				mark("missing right bracket");
				exit(-1);
			}
		
		/* deal with record access */
		} else { 
			getSymbol();
			if (currentSymbol == SYMBOL_IDENTIFIER) {
				type = getType(x->typeIndex);
				if (type->base->form == FORM_RECORD) {
					obj = findField(type->base->fields);
					getSymbol();
				}
				if (obj != guard) {
					emitField(x,obj,indLev);
				} else {
					mark("field undef");
					exit(-1);
				}
			} else {
				mark("missing identifier");
				exit(-1);
			}
			indLev = indLev + 1;
		}
	}
}